

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector4<LFPConsumer_python_*,_PythonModuleClient_&,_unsigned_long,_boost::python::list_&>_>
::operator()(impl<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector4<LFPConsumer_python_*,_PythonModuleClient_&,_unsigned_long,_boost::python::list_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  int iVar2;
  LFPConsumer_python *p;
  long lVar3;
  LFPConsumer_python *p_00;
  PyObject *pPVar4;
  code *pcVar5;
  long *plVar6;
  code *pcVar7;
  undefined8 *puVar8;
  c_t2 c2;
  c_t1 c1;
  list local_58;
  undefined1 local_50 [16];
  _object *local_38;
  
  lVar3 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<PythonModuleClient_const_volatile&>::
                     converters);
  if (lVar3 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_50 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::registered_base<unsigned_long_const_volatile&>::
                                 converters);
    pcVar5 = local_50._8_8_;
    puVar8 = local_50._0_8_;
    if (puVar8 != (undefined8 *)0x0) {
      local_58.super_list_base.super_object.super_object_base.m_ptr = (list_base)args_[2].ob_type;
      *(long *)local_58.super_list_base.super_object.super_object_base.m_ptr =
           *(long *)local_58.super_list_base.super_object.super_object_base.m_ptr + 1;
      local_38 = p_Var1;
      iVar2 = PyObject_IsInstance(local_58.super_list_base.super_object.super_object_base.m_ptr,
                                  &PyList_Type);
      if (iVar2 == 0) {
        pPVar4 = (PyObject *)0x0;
      }
      else {
        pcVar7 = (code *)(this->m_data).
                         super_compressed_pair_imp<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_2>
                         .first_;
        plVar6 = (long *)(lVar3 + *(long *)&(this->m_data).
                                            super_compressed_pair_imp<LFPConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_2>
                                            .field_0x8);
        if (((ulong)pcVar7 & 1) != 0) {
          pcVar7 = *(code **)(pcVar7 + *plVar6 + -1);
        }
        if (pcVar5 != (code *)0x0) {
          (*pcVar5)(p_Var1,local_50);
          puVar8 = (undefined8 *)local_50._0_8_;
        }
        p_00 = (LFPConsumer_python *)(*pcVar7)(plVar6,*puVar8,&local_58);
        if (p_00 == (LFPConsumer_python *)0x0) {
          pPVar4 = (PyObject *)&_Py_NoneStruct;
        }
        else {
          pPVar4 = (p_00->super_wrapper<LFPConsumer>).super_wrapper_base.m_self;
          if (pPVar4 == (PyObject *)0x0) {
            pPVar4 = make_owning_holder::execute<LFPConsumer_python>(p_00);
            goto LAB_00248e7e;
          }
        }
        pPVar4->ob_refcnt = pPVar4->ob_refcnt + 1;
      }
LAB_00248e7e:
      value_destroyer<false>::execute<boost::python::list>(&local_58);
      return pPVar4;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }